

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

bool __thiscall pfederc::Parser::skipToEol(Parser *this)

{
  bool bVar1;
  Token *pTVar2;
  bool local_19;
  Parser *this_local;
  
  while( true ) {
    pTVar2 = Lexer::getCurrentToken(this->lexer);
    bVar1 = Token::operator!=(pTVar2,TOK_EOL);
    local_19 = false;
    if (bVar1) {
      pTVar2 = Lexer::getCurrentToken(this->lexer);
      local_19 = Token::operator!=(pTVar2,TOK_EOF);
    }
    if (local_19 == false) break;
    Lexer::next(this->lexer);
  }
  pTVar2 = Lexer::getCurrentToken(this->lexer);
  bVar1 = Token::operator!=(pTVar2,TOK_EOF);
  return bVar1;
}

Assistant:

bool Parser::skipToEol() noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_EOL
      && *lexer.getCurrentToken() != TokenType::TOK_EOF)
    lexer.next();

  return *lexer.getCurrentToken() != TokenType::TOK_EOF;
}